

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

void helics::addTimeState(json *output,TimeState state)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  string_view sstring;
  data local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  if (state < (error|exec_requested_require_iteration)) {
    local_18._M_len = *(size_t *)(&DAT_003ef890 + (ulong)state * 8);
    local_18._M_str = &DAT_003ef8e8 + *(int *)(&DAT_003ef8e8 + (ulong)state * 4);
  }
  else {
    local_18._M_str = "other";
    local_18._M_len = 5;
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::
  basic_json<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_28,&local_18);
  pvVar3 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)output,"state");
  vVar1 = (pvVar3->m_data).m_type;
  (pvVar3->m_data).m_type = local_28.m_type;
  jVar2 = (pvVar3->m_data).m_value;
  (pvVar3->m_data).m_value = local_28.m_value;
  local_28.m_type = vVar1;
  local_28.m_value = jVar2;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_28);
  return;
}

Assistant:

void addTimeState(nlohmann::json& output, const TimeState state)
{
    auto sstring = timeStateString(state);
    output["state"] = sstring;
}